

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall tlx::CmdlineParser::print_result(CmdlineParser *this,ostream *os)

{
  Argument *this_00;
  bool bVar1;
  fmtflags __fmtfl;
  _Setw _Var2;
  int iVar3;
  unsigned_long *puVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  reference ppAVar6;
  undefined4 extraout_var_00;
  allocator local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string typestr_1;
  Argument *arg_1;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_f8;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_f0;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string typestr;
  string local_70;
  int local_4c;
  Argument *local_48;
  Argument *arg;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_38;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_30;
  const_iterator it;
  size_t maxlong;
  fmtflags flags;
  ostream *os_local;
  CmdlineParser *this_local;
  
  __fmtfl = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  puVar4 = std::max<unsigned_long>(&this->param_max_width_,&this->option_max_width_);
  it._M_current = (Argument **)*puVar4;
  bVar1 = std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          empty(&this->param_list_);
  if (!bVar1) {
    poVar5 = std::operator<<(os,"Parameters:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_38._M_current =
         (Argument **)
         std::
         vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
         begin(&this->param_list_);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
    ::__normal_iterator<tlx::CmdlineParser::Argument**>
              ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                *)&local_30,&local_38);
    while( true ) {
      arg = (Argument *)
            std::
            vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ::end(&this->param_list_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          *)&arg);
      if (!bVar1) break;
      ppAVar6 = __gnu_cxx::
                __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                ::operator*(&local_30);
      local_48 = *ppAVar6;
      poVar5 = std::operator<<(os,"  ");
      local_4c = (int)std::setw((int)it._M_current);
      poVar5 = std::operator<<(poVar5,(_Setw)local_4c);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
      Argument::param_text_abi_cxx11_(&local_70,local_48);
      std::operator<<(poVar5,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      iVar3 = (*local_48->_vptr_Argument[2])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,(char *)CONCAT44(extraout_var,iVar3),
                 (allocator *)((long)&it_1._M_current + 7));
      std::operator+(&local_c0,"(",&local_e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_c0,")");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
      it_1._M_current._0_4_ = std::setw(0x14);
      poVar5 = std::operator<<(os,it_1._M_current._0_4_);
      std::operator<<(poVar5,(string *)local_a0);
      (*local_48->_vptr_Argument[4])(local_48,os);
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_a0);
      __gnu_cxx::
      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
      ::operator++(&local_30);
    }
  }
  bVar1 = std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          empty(&this->option_list_);
  if (!bVar1) {
    poVar5 = std::operator<<(os,"Options:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_f8._M_current =
         (Argument **)
         std::
         vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
         begin(&this->option_list_);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
    ::__normal_iterator<tlx::CmdlineParser::Argument**>
              ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                *)&local_f0,&local_f8);
    while( true ) {
      arg_1 = (Argument *)
              std::
              vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ::end(&this->option_list_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          *)&arg_1);
      if (!bVar1) break;
      ppAVar6 = __gnu_cxx::
                __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                ::operator*(&local_f0);
      this_00 = *ppAVar6;
      poVar5 = std::operator<<(os,"  ");
      _Var2 = std::setw((int)it._M_current);
      poVar5 = std::operator<<(poVar5,_Var2);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
      Argument::option_text_abi_cxx11_((string *)(typestr_1.field_2._M_local_buf + 8),this_00);
      std::operator<<(poVar5,(string *)(typestr_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(typestr_1.field_2._M_local_buf + 8));
      iVar3 = (*this_00->_vptr_Argument[2])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_190,(char *)CONCAT44(extraout_var_00,iVar3),&local_191);
      std::operator+(&local_170,"(",&local_190);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     &local_170,")");
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      _Var2 = std::setw(0x14);
      poVar5 = std::operator<<(os,_Var2);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
      std::operator<<(poVar5,(string *)local_150);
      (*this_00->_vptr_Argument[4])(this_00,os);
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_150);
      __gnu_cxx::
      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
      ::operator++(&local_f0);
    }
  }
  std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)),__fmtfl);
  return;
}

Assistant:

void CmdlineParser::print_result(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    size_t maxlong = std::max(param_max_width_, option_max_width_);

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->param_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->option_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << std::left << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    os.flags(flags);
}